

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

char * __thiscall cmMakefile::CompileFeaturesAvailable(cmMakefile *this,string *lang,string *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  char *pcVar3;
  ostream *poVar4;
  size_t sVar5;
  size_type *psVar6;
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  std::operator+(&local_228,"CMAKE_",lang);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_228);
  psVar6 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar6) {
    local_1a8._16_8_ = *psVar6;
    local_1a8._24_8_ = plVar2[3];
    local_1a8._0_8_ = local_1a8 + 0x10;
  }
  else {
    local_1a8._16_8_ = *psVar6;
    local_1a8._0_8_ = (size_type *)*plVar2;
  }
  local_1a8._8_8_ = plVar2[1];
  *plVar2 = (long)psVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  pcVar3 = GetDefinition(this,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  paVar1 = &local_228.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar3 = "no";
    if (error == (string *)0x0) {
      pcVar3 = "No";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," known features for ",0x14);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(lang->_M_dataplus)._M_p,lang->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," compiler\n\"",0xb);
    std::operator+(&local_1c8,"CMAKE_",lang);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    psVar6 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_228.field_2._M_allocated_capacity = *psVar6;
      local_228.field_2._8_8_ = plVar2[3];
      local_228._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_228.field_2._M_allocated_capacity = *psVar6;
      local_228._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_228._M_string_length = plVar2[1];
    *plVar2 = (long)psVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    pcVar3 = GetDefinition(this,&local_228);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\nversion ",10);
    std::operator+(&local_1e8,"CMAKE_",lang);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    psVar6 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_208.field_2._M_allocated_capacity = *psVar6;
      local_208.field_2._8_8_ = plVar2[3];
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    }
    else {
      local_208.field_2._M_allocated_capacity = *psVar6;
      local_208._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_208._M_string_length = plVar2[1];
    *plVar2 = (long)psVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    pcVar3 = GetDefinition(this,&local_208);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar1) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if (error == (string *)0x0) {
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,&local_228,false);
    }
    else {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)error,(string *)&local_228);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar1) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    pcVar3 = (char *)0x0;
  }
  return pcVar3;
}

Assistant:

const char* cmMakefile::
CompileFeaturesAvailable(const std::string& lang, std::string *error) const
{
  const char* featuresKnown =
    this->GetDefinition("CMAKE_" + lang + "_COMPILE_FEATURES");

  if (!featuresKnown || !*featuresKnown)
    {
    std::ostringstream e;
    if (error)
      {
      e << "no";
      }
    else
      {
      e << "No";
      }
    e << " known features for " << lang << " compiler\n\""
      << this->GetDefinition("CMAKE_" + lang + "_COMPILER_ID")
      << "\"\nversion "
      << this->GetDefinition("CMAKE_" + lang + "_COMPILER_VERSION") << ".";
    if (error)
      {
      *error = e.str();
      }
    else
      {
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      }
    return 0;
    }
  return featuresKnown;
}